

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::dragEnterEvent(QAbstractItemView *this,QDragEnterEvent *event)

{
  bool bVar1;
  DragDropMode DVar2;
  QAbstractItemView *pQVar3;
  
  DVar2 = dragDropMode(this);
  if (DVar2 == InternalMove) {
    pQVar3 = (QAbstractItemView *)QDropEvent::source();
    if (pQVar3 != this) {
      return;
    }
    if (((byte)event[0x28] & 2) == 0) {
      return;
    }
  }
  bVar1 = QAbstractItemViewPrivate::canDrop
                    (*(QAbstractItemViewPrivate **)(this + 8),(QDropEvent *)event);
  if (bVar1) {
    event[0xc] = (QDragEnterEvent)0x1;
    *(undefined4 *)(*(long *)(this + 8) + 0x3a8) = 1;
  }
  else {
    event[0xc] = (QDragEnterEvent)0x0;
  }
  return;
}

Assistant:

void QAbstractItemView::dragEnterEvent(QDragEnterEvent *event)
{
    if (dragDropMode() == InternalMove
        && (event->source() != this|| !(event->possibleActions() & Qt::MoveAction)))
        return;

    if (d_func()->canDrop(event)) {
        event->accept();
        setState(DraggingState);
    } else {
        event->ignore();
    }
}